

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O3

string * __thiscall
ktx::DiffArray<unsigned_char,8ul>::value_abi_cxx11_
          (string *__return_storage_ptr__,void *this,size_t index,OutputFormat format)

{
  size_type sVar1;
  bool bVar2;
  string *psVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  size_t arrayIndex;
  long lVar4;
  format_args args;
  format_args args_00;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> args_01;
  string_view fmt;
  string_view fmt_00;
  string comma;
  stringstream formattedValue;
  string local_220;
  string *local_200;
  OutputFormat local_1f4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  size_type sStack_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  size_type sStack_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  stringstream local_1b8 [16];
  basic_ostream<char,_std::char_traits<char>_> local_1a8 [112];
  ios_base local_138 [264];
  
  local_200 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x1fecc1;
  if (format == json_mini) {
    local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x217ddc;
  }
  bVar2 = true;
  lVar4 = 0;
  local_1f4 = format;
  do {
    if (bVar2) {
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"");
    }
    else {
      local_1e8 = local_1f0;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&local_1e8;
      fmt.size_ = 0xc;
      fmt.data_ = (char *)0x3;
      ::fmt::v10::vformat_abi_cxx11_(&local_220,(v10 *)0x1fbf4e,fmt,args);
    }
    local_1d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(ulong)*(byte *)((long)this + lVar4 + index * 9 + 0x28);
    local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p;
    sStack_1e0 = local_220._M_string_length;
    format_str.size_ = 4;
    format_str.data_ = "{}{}";
    args_01.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_1e8;
    args_01.desc_ = 0x2d;
    ::fmt::v10::vprint<char>(local_1a8,format_str,args_01);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    psVar3 = local_200;
    lVar4 = lVar4 + 1;
    bVar2 = false;
  } while (lVar4 != 8);
  if (local_1f4 == text) {
    std::__cxx11::stringbuf::str();
  }
  else {
    std::__cxx11::stringbuf::str();
    sVar1 = sStack_1e0;
    if (local_1e8 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)&local_1d8) {
      operator_delete(local_1e8,(ulong)(local_1d8->_M_local_buf + 1));
    }
    psVar3 = local_200;
    if (sVar1 == 0) {
      (local_200->_M_dataplus)._M_p = (pointer)&local_200->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"[]","");
    }
    else {
      std::__cxx11::stringbuf::str();
      psVar3 = local_200;
      local_1e8 = local_1f0;
      local_1d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._M_dataplus._M_p;
      sStack_1d0 = local_220._M_string_length;
      local_1c8 = local_1f0;
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&local_1e8;
      fmt_00.size_ = 0xcdc;
      fmt_00.data_ = (char *)0x8;
      ::fmt::v10::vformat_abi_cxx11_(local_200,(v10 *)"[{}{}{}]",fmt_00,args_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
    }
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

virtual std::string value(std::size_t index, OutputFormat format) const override {
        const auto space = format != OutputFormat::json_mini ?  " " : "";

        std::stringstream formattedValue;
        bool first = true;
        for (std::size_t arrayIndex = 0; arrayIndex < N; ++arrayIndex) {
            const auto comma = std::exchange(first, false) ? "" : fmt::format(",{}", space);
            fmt::print(formattedValue, "{}{}", comma, DiffBase<std::array<T, N>>::rawValue(index)[arrayIndex]);
        }

        if (format == OutputFormat::text) {
            return formattedValue.str();
        } else {
            if (formattedValue.str().empty()) {
                return "[]";
            } else {
                return fmt::format("[{}{}{}]", space, formattedValue.str(), space);
            }
        }
    }